

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  allocator<char> local_41;
  string local_40;
  byte local_1d;
  mode_t local_1c;
  bool honor_umask_local;
  char *pcStack_18;
  mode_t mode_local;
  char *file_local;
  
  local_1d = honor_umask;
  local_1c = mode;
  pcStack_18 = file;
  if (file == (char *)0x0) {
    file_local = (char *)Status::POSIX(0x16);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,file,&local_41);
    file_local = (char *)SetPermissions(&local_40,local_1c,(bool)(local_1d & 1));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (Status)file_local;
}

Assistant:

Status SystemTools::SetPermissions(const char* file, mode_t mode,
                                   bool honor_umask)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}